

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_musig_compute_noncehash
               (uchar *noncehash,secp256k1_ge *aggnonce,uchar *agg_pk32,uchar *msg)

{
  int i;
  secp256k1_sha256 sha;
  uchar buf [33];
  undefined4 local_b4;
  size_t in_stack_ffffffffffffff50;
  secp256k1_ge *in_stack_ffffffffffffff58;
  secp256k1_sha256 *in_stack_ffffffffffffff60;
  
  secp256k1_musig_compute_noncehash_sha256_tagged((secp256k1_sha256 *)0x1327f1);
  for (local_b4 = 0; local_b4 < 2; local_b4 = local_b4 + 1) {
    secp256k1_musig_ge_serialize_ext((uchar *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    secp256k1_sha256_write
              (in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50);
  }
  secp256k1_sha256_write
            (in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
  ;
  secp256k1_sha256_write
            (in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
  ;
  secp256k1_sha256_finalize(in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58);
  return;
}

Assistant:

static void secp256k1_musig_compute_noncehash(unsigned char *noncehash, secp256k1_ge *aggnonce, const unsigned char *agg_pk32, const unsigned char *msg) {
    unsigned char buf[33];
    secp256k1_sha256 sha;
    int i;

    secp256k1_musig_compute_noncehash_sha256_tagged(&sha);
    for (i = 0; i < 2; i++) {
        secp256k1_musig_ge_serialize_ext(buf, &aggnonce[i]);
        secp256k1_sha256_write(&sha, buf, sizeof(buf));
    }
    secp256k1_sha256_write(&sha, agg_pk32, 32);
    secp256k1_sha256_write(&sha, msg, 32);
    secp256k1_sha256_finalize(&sha, noncehash);
}